

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test7::generateXFBVaryingNames(GPUShaderFP64Test7 *this,_variables *variables)

{
  bool bVar1;
  ulong uVar2;
  GLchar **ppGVar3;
  ostream *poVar4;
  GLchar *pGVar5;
  void *__src;
  string local_240 [32];
  string local_220 [48];
  size_t local_1f0;
  size_t varying_length;
  stringstream varying_sstream;
  ostream local_1d8;
  uint local_5c;
  reference p_Stack_58;
  uint array_index;
  _variable *variable_1;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
  local_48;
  _variables_const_iterator variables_iterator_1;
  _variable *variable;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
  local_30;
  _variables_const_iterator variables_iterator;
  uint local_20;
  uint n_varyings;
  uint n_varying;
  uint n_variable;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  
  n_varyings = 0;
  local_20 = 0;
  variables_iterator._M_current._4_4_ = 0;
  if (this->m_xfb_varyings != (GLchar **)0x0) {
    releaseXFBVaryingNames(this);
  }
  local_30._M_current =
       (_variable *)
       std::
       vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
       ::begin(variables);
  while( true ) {
    variable = (_variable *)
               std::
               vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               ::end(variables);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
                        *)&variable);
    if (!bVar1) break;
    variables_iterator_1._M_current =
         __gnu_cxx::
         __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
         ::operator*(&local_30);
    variables_iterator._M_current._4_4_ =
         (variables_iterator_1._M_current)->array_size + variables_iterator._M_current._4_4_;
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
    ::operator++(&local_30);
  }
  uVar2 = SUB168(ZEXT416(variables_iterator._M_current._4_4_) * ZEXT816(8),0);
  if (SUB168(ZEXT416(variables_iterator._M_current._4_4_) * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppGVar3 = (GLchar **)operator_new__(uVar2);
  this->m_xfb_varyings = ppGVar3;
  local_48._M_current =
       (_variable *)
       std::
       vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
       ::begin(variables);
  while( true ) {
    variable_1 = (_variable *)
                 std::
                 vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                 ::end(variables);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
                        *)&variable_1);
    if (!bVar1) break;
    p_Stack_58 = __gnu_cxx::
                 __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
                 ::operator*(&local_48);
    for (local_5c = 0; local_5c < p_Stack_58->array_size; local_5c = local_5c + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&varying_length);
      poVar4 = std::operator<<(&local_1d8,"gs_variable");
      std::ostream::operator<<(poVar4,n_varyings);
      if (1 < p_Stack_58->array_size) {
        poVar4 = std::operator<<(&local_1d8,"[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_5c);
        std::operator<<(poVar4,"]");
      }
      std::__cxx11::stringstream::str();
      local_1f0 = std::__cxx11::string::length();
      std::__cxx11::string::~string(local_220);
      pGVar5 = (GLchar *)operator_new__(local_1f0 + 1);
      this->m_xfb_varyings[local_20] = pGVar5;
      pGVar5 = this->m_xfb_varyings[local_20];
      std::__cxx11::stringstream::str();
      __src = (void *)std::__cxx11::string::c_str();
      memcpy(pGVar5,__src,local_1f0);
      std::__cxx11::string::~string(local_240);
      this->m_xfb_varyings[local_20][local_1f0] = '\0';
      std::__cxx11::stringstream::~stringstream((stringstream *)&varying_length);
      local_20 = local_20 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
    ::operator++(&local_48);
    n_varyings = n_varyings + 1;
  }
  this->m_n_xfb_varyings = variables_iterator._M_current._4_4_;
  return;
}

Assistant:

void GPUShaderFP64Test7::generateXFBVaryingNames(const _variables& variables)
{
	unsigned int n_variable = 0;
	unsigned int n_varying  = 0;
	unsigned int n_varyings = 0;

	if (m_xfb_varyings != NULL)
	{
		releaseXFBVaryingNames();
	}

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 ++variables_iterator)
	{
		const _variable& variable = *variables_iterator;

		n_varyings += variable.array_size;
	}

	m_xfb_varyings = new glw::GLchar*[n_varyings];

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 ++variables_iterator, ++n_variable)
	{
		const _variable& variable = *variables_iterator;

		for (unsigned int array_index = 0; array_index < variable.array_size; ++array_index, ++n_varying)
		{
			std::stringstream varying_sstream;
			size_t			  varying_length;

			varying_sstream << "gs_variable" << n_variable;

			if (variable.array_size > 1)
			{
				varying_sstream << "[" << array_index << "]";
			}

			/* Store the varying name */
			varying_length			  = varying_sstream.str().length();
			m_xfb_varyings[n_varying] = new glw::GLchar[varying_length + 1 /* terminator */];

			memcpy(m_xfb_varyings[n_varying], varying_sstream.str().c_str(), varying_length);
			m_xfb_varyings[n_varying][varying_length] = 0;
		} /* for (all array indices) */
	}	 /* for (all varyings) */

	m_n_xfb_varyings = n_varyings;
}